

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_all.cc
# Opt level: O0

RSA * pkey_get_rsa(EVP_PKEY *key,RSA **rsa)

{
  RSA *rtmp;
  RSA **rsa_local;
  EVP_PKEY *key_local;
  
  if (key == (EVP_PKEY *)0x0) {
    key_local = (EVP_PKEY *)0x0;
  }
  else {
    key_local = (EVP_PKEY *)EVP_PKEY_get1_RSA((EVP_PKEY *)key);
    EVP_PKEY_free((EVP_PKEY *)key);
    if ((RSA *)key_local == (RSA *)0x0) {
      key_local = (EVP_PKEY *)0x0;
    }
    else if (rsa != (RSA **)0x0) {
      RSA_free((RSA *)*rsa);
      *rsa = (RSA *)key_local;
    }
  }
  return (RSA *)key_local;
}

Assistant:

static RSA *pkey_get_rsa(EVP_PKEY *key, RSA **rsa) {
  RSA *rtmp;
  if (!key) {
    return NULL;
  }
  rtmp = EVP_PKEY_get1_RSA(key);
  EVP_PKEY_free(key);
  if (!rtmp) {
    return NULL;
  }
  if (rsa) {
    RSA_free(*rsa);
    *rsa = rtmp;
  }
  return rtmp;
}